

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O0

bool __thiscall QGraphicsLayoutItemPrivate::hasHeightForWidth(QGraphicsLayoutItemPrivate *this)

{
  bool bVar1;
  QGraphicsLayoutItemPrivate *this_00;
  QGraphicsItem *pQVar2;
  QGraphicsLayout *pQVar3;
  QGraphicsLayoutItemPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsWidget *w;
  QGraphicsItem *item;
  int i;
  QGraphicsLayout *l;
  QGraphicsLayoutItem *q;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  uint local_2c;
  QGraphicsLayoutItemPrivate *this_01;
  bool local_d;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QGraphicsLayoutItemPrivate *)q_func(in_RDI);
  if (((byte)in_RDI->field_0xb0 >> 2 & 1) == 0) {
    pQVar2 = QGraphicsLayoutItem::graphicsItem((QGraphicsLayoutItem *)0x9b4bca);
    if (((pQVar2 == (QGraphicsItem *)0x0) ||
        (bVar1 = QGraphicsItem::isWidget((QGraphicsItem *)0x9b4be1), !bVar1)) ||
       (pQVar3 = QGraphicsWidget::layout
                           ((QGraphicsWidget *)
                            CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0)),
       pQVar3 == (QGraphicsLayout *)0x0)) {
LAB_009b4c52:
      local_c.bits = (Bits)QGraphicsLayoutItem::sizePolicy
                                     ((QGraphicsLayoutItem *)
                                      CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0))
      ;
      local_d = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_c.bits);
    }
    else {
      QGraphicsWidget::layout
                ((QGraphicsWidget *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
      get((QGraphicsLayoutItem *)0x9b4c3c);
      local_d = hasHeightForWidth(this_00);
    }
  }
  else {
    this_01 = this_00;
    local_2c = (*this_00->_vptr_QGraphicsLayoutItemPrivate[9])();
    do {
      local_2c = local_2c - 1;
      if ((int)local_2c < 0) goto LAB_009b4c52;
      (*this_00->_vptr_QGraphicsLayoutItemPrivate[10])(this_00,(ulong)local_2c);
      get((QGraphicsLayoutItem *)0x9b4b94);
      bVar1 = hasHeightForWidth(this_01);
    } while (!bVar1);
    local_d = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_d;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsLayoutItemPrivate::hasHeightForWidth() const
{
    Q_Q(const QGraphicsLayoutItem);
    if (isLayout) {
        const QGraphicsLayout *l = static_cast<const QGraphicsLayout *>(q);
        for (int i = l->count() - 1; i >= 0; --i) {
            if (QGraphicsLayoutItemPrivate::get(l->itemAt(i))->hasHeightForWidth())
                return true;
        }
    } else if (QGraphicsItem *item = q->graphicsItem()) {
        if (item->isWidget()) {
            QGraphicsWidget *w = static_cast<QGraphicsWidget *>(item);
            if (w->layout()) {
                return QGraphicsLayoutItemPrivate::get(w->layout())->hasHeightForWidth();
            }
        }
    }
    return q->sizePolicy().hasHeightForWidth();
}